

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rxcollector.cpp
# Opt level: O0

QVariantList * __thiscall
RXCollector::modelsLists
          (QVariantList *__return_storage_ptr__,RXCollector *this,QList<QStringListModel_*> *models)

{
  long lVar1;
  qsizetype qVar2;
  const_reference ppQVar3;
  QList<QString> local_68;
  QVariant local_50;
  QStringListModel *local_30;
  QStringListModel *m;
  int i;
  QList<QStringListModel_*> *models_local;
  RXCollector *this_local;
  QVariantList *exps;
  
  m._7_1_ = 0;
  _i = models;
  models_local = &this->mPathPatterns;
  this_local = (RXCollector *)__return_storage_ptr__;
  QList<QVariant>::QList(__return_storage_ptr__);
  for (m._0_4_ = 0; lVar1 = (long)(int)m, qVar2 = QList<QStringListModel_*>::size(_i), lVar1 < qVar2
      ; m._0_4_ = (int)m + 1) {
    ppQVar3 = QList<QStringListModel_*>::operator[](_i,(long)(int)m);
    local_30 = *ppQVar3;
    QStringListModel::stringList();
    QVariant::QVariant(&local_50,(QList_conflict2 *)&local_68);
    QList<QVariant>::append(__return_storage_ptr__,&local_50);
    QVariant::~QVariant(&local_50);
    QList<QString>::~QList(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariantList RXCollector::modelsLists(const QList<QStringListModel *> &models) {
    QVariantList exps;
    for(int i=0;i<models.size();i++) {
        QStringListModel* m = models[i];
        exps.append(m->stringList());
    }
    return exps;
}